

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O0

input_t inputroutine_keyboard(tgestate_t *state)

{
  byte bVar1;
  long in_RDI;
  uint8_t key_pressed;
  uint16_t port;
  input_t inputs;
  keydef_t *def;
  undefined4 local_14;
  undefined8 local_10;
  
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))
                    (*(undefined8 *)(in_RDI + 0x18),(ushort)*(byte *)(in_RDI + 0x780) << 8 | 0xfe);
  if (((bVar1 ^ 0xff) & *(byte *)(in_RDI + 0x781)) == 0) {
    bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))
                      (*(undefined8 *)(in_RDI + 0x18),(ushort)*(byte *)(in_RDI + 0x782) << 8 | 0xfe)
    ;
    if (((bVar1 ^ 0xff) & *(byte *)(in_RDI + 0x783)) == 0) {
      local_14 = 0;
    }
    else {
      local_14 = 6;
    }
  }
  else {
    local_14 = 3;
  }
  local_10 = (byte *)(in_RDI + 0x784);
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))
                    (*(undefined8 *)(in_RDI + 0x18),(ushort)*local_10 << 8 | 0xfe);
  if (((bVar1 ^ 0xff) & *(byte *)(in_RDI + 0x785)) == 0) {
    bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))
                      (*(undefined8 *)(in_RDI + 0x18),(ushort)*(byte *)(in_RDI + 0x786) << 8 | 0xfe)
    ;
    if (((bVar1 ^ 0xff) & *(byte *)(in_RDI + 0x787)) != 0) {
      local_14 = local_14 + 2;
    }
  }
  else {
    local_14 = local_14 + 1;
  }
  local_10 = (byte *)(in_RDI + 0x788);
  bVar1 = (*(code *)**(undefined8 **)(in_RDI + 0x18))
                    (*(undefined8 *)(in_RDI + 0x18),(ushort)*local_10 << 8 | 0xfe);
  if (((bVar1 ^ 0xff) & *(byte *)(in_RDI + 0x789)) != 0) {
    local_14 = local_14 + 9;
  }
  return local_14;
}

Assistant:

static input_t inputroutine_keyboard(tgestate_t *state)
{
  const keydef_t *def;         /* was HL */
  input_t         inputs;      /* was E */
  uint16_t        port;        /* was BC */
  uint8_t         key_pressed; /* was A */

  assert(state != NULL);

  def = &state->keydefs.defs[0]; /* A list of (port high byte, key mask) */

  /* Left or right? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  def++;
  if (key_pressed)
  {
    def++; /* Skip right keydef */
    inputs = input_LEFT;
  }
  else
  {
    /* Right */
    port = (def->port << 8) | 0xFE;
    key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
    def++;
    if (key_pressed)
      inputs = input_RIGHT;
    else
      inputs = input_NONE; /* == 0 */
  }

  /* Up or down? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  def++;
  if (key_pressed)
  {
    def++; /* Skip down keydef */
    inputs += input_UP;
  }
  else
  {
    /* Down */
    port = (def->port << 8) | 0xFE;
    key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
    def++;
    if (key_pressed)
      inputs += input_DOWN;
  }

  /* Fire? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  if (key_pressed)
    inputs += input_FIRE;

  return inputs;
}